

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O2

void __thiscall
booster::callback<int_()>::callback<call_counter>(callback<int_()> *this,call_counter func)

{
  callable_impl<int,_call_counter> *this_00;
  
  this_00 = (callable_impl<int,_call_counter> *)operator_new(0x18);
  callable_impl<int,_call_counter>::callable_impl(this_00,func);
  (this->call_ptr).p_ = (callable<int_()> *)this_00;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}